

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRReader.cpp
# Opt level: O2

Barcodes * __thiscall
ZXing::QRCode::Reader::decode
          (Barcodes *__return_storage_ptr__,Reader *this,BinaryBitmap *image,int maxSymbols)

{
  bool bVar1;
  uint uVar2;
  BitMatrix *image_00;
  FinderPatternSet *fp;
  pointer v;
  pointer pCVar3;
  FinderPatternSets allFPSets;
  FinderPatterns allFPs;
  DetectorResult detectorResult;
  vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> usedFPs;
  DecoderResult decoderResult;
  BarcodeFormat local_18c;
  _Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
  local_188;
  _Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> local_170;
  DetectorResult local_158;
  _Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> local_118;
  DecoderResult local_100;
  
  image_00 = BinaryBitmap::getBitMatrix(image);
  if (image_00 == (BitMatrix *)0x0) {
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    FindFinderPatterns((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                        *)&local_170,image_00,
                       (bool)((byte)*(undefined4 *)(this->super_Reader)._opts & 1));
    local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar2 = (((this->super_Reader)._opts)->_formats).i;
    if (uVar2 == 0 || (uVar2 >> 0xd & 1) != 0) {
      GenerateFinderPatternSets((FinderPatternSets *)&local_188,(FinderPatterns *)&local_170);
      for (fp = (FinderPatternSet *)
                CONCAT44(local_188._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_188._M_impl.super__Vector_impl_data._M_start._0_4_);
          fp != local_188._M_impl.super__Vector_impl_data._M_finish; fp = fp + 1) {
        bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                          ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                            *)&local_118,&fp->bl);
        if (!bVar1) {
          bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                            ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                              *)&local_118,&fp->tl);
          if (!bVar1) {
            bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                              ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                                *)&local_118,&fp->tr);
            if (!bVar1) {
              SampleQR(&local_158,image_00,fp);
              if (local_158._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_158._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                Decode(&local_100,&local_158._bits);
                if ((local_100._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                     local_100._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish) && (local_100._error._type == None)) {
                  std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
                  push_back((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                             *)&local_118,&fp->bl);
                  std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
                  push_back((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                             *)&local_118,&fp->tl);
                  std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
                  push_back((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                             *)&local_118,&fp->tr);
                }
                uVar2 = *(uint *)(this->super_Reader)._opts;
                if (local_100._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    local_100._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  if (((byte)(uVar2 >> 9) & local_100._error._type != None) != 0) goto LAB_00195037;
                }
                else if ((uVar2 >> 9 & 1) != 0 || local_100._error._type == None) {
LAB_00195037:
                  local_18c = QRCode;
                  std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
                  emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                            ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)
                             __return_storage_ptr__,&local_100,&local_158,&local_18c);
                  if ((maxSymbols != 0) &&
                     ((int)(((long)(__return_storage_ptr__->
                                   super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(__return_storage_ptr__->
                                  super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>)
                                  ._M_impl.super__Vector_impl_data._M_start) / 0xd8) == maxSymbols))
                  {
                    DecoderResult::~DecoderResult(&local_100);
                    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                              (&local_158._bits._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
                    break;
                  }
                }
                DecoderResult::~DecoderResult(&local_100);
              }
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_158._bits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            }
          }
        }
      }
      std::
      _Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
      ::~_Vector_base(&local_188);
      uVar2 = (((this->super_Reader)._opts)->_formats).i;
    }
    pCVar3 = local_170._M_impl.super__Vector_impl_data._M_finish;
    if ((uVar2 == 0 || (uVar2 >> 0x10 & 1) != 0) &&
       ((maxSymbols == 0 ||
        ((int)(((long)(__return_storage_ptr__->
                      super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(__return_storage_ptr__->
                     super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0xd8) != maxSymbols)))) {
      for (v = local_170._M_impl.super__Vector_impl_data._M_start; v != pCVar3; v = v + 1) {
        bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                          ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                            *)&local_118,v);
        if (!bVar1) {
          SampleMQR(&local_158,image_00,v);
          if (local_158._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_158._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            Decode(&local_100,&local_158._bits);
            uVar2 = *(uint *)(this->super_Reader)._opts;
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              if (((byte)(uVar2 >> 9) & local_100._error._type != None) != 0) goto LAB_00195230;
            }
            else if ((uVar2 >> 9 & 1) != 0 || local_100._error._type == None) {
LAB_00195230:
              local_188._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x10000;
              std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
              emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                        ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)
                         __return_storage_ptr__,&local_100,&local_158,(BarcodeFormat *)&local_188);
              if ((maxSymbols != 0) &&
                 ((int)(((long)(__return_storage_ptr__->
                               super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(__return_storage_ptr__->
                              super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                              _M_impl.super__Vector_impl_data._M_start) / 0xd8) == maxSymbols)) {
                DecoderResult::~DecoderResult(&local_100);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          (&local_158._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
                break;
              }
            }
            DecoderResult::~DecoderResult(&local_100);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_158._bits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
      }
    }
    uVar2 = (((this->super_Reader)._opts)->_formats).i;
    if ((uVar2 == 0 || (uVar2 >> 0x11 & 1) != 0) &&
       ((maxSymbols == 0 ||
        ((int)(((long)(__return_storage_ptr__->
                      super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(__return_storage_ptr__->
                     super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0xd8) != maxSymbols)))) {
      for (pCVar3 = local_170._M_impl.super__Vector_impl_data._M_start;
          pCVar3 != local_170._M_impl.super__Vector_impl_data._M_finish; pCVar3 = pCVar3 + 1) {
        bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                          ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                            *)&local_118,pCVar3);
        if (!bVar1) {
          SampleRMQR(&local_158,image_00,pCVar3);
          if (local_158._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_158._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            Decode(&local_100,&local_158._bits);
            uVar2 = *(uint *)(this->super_Reader)._opts;
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              if (((byte)(uVar2 >> 9) & local_100._error._type != None) != 0) goto LAB_00195335;
            }
            else if ((uVar2 >> 9 & 1) != 0 || local_100._error._type == None) {
LAB_00195335:
              local_188._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x20000;
              std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
              emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                        ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)
                         __return_storage_ptr__,&local_100,&local_158,(BarcodeFormat *)&local_188);
              if ((maxSymbols != 0) &&
                 ((int)(((long)(__return_storage_ptr__->
                               super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(__return_storage_ptr__->
                              super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                              _M_impl.super__Vector_impl_data._M_start) / 0xd8) == maxSymbols)) {
                DecoderResult::~DecoderResult(&local_100);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          (&local_158._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
                break;
              }
            }
            DecoderResult::~DecoderResult(&local_100);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_158._bits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
      }
    }
    std::_Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
    ~_Vector_base(&local_118);
    std::_Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
    ~_Vector_base(&local_170);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcodes Reader::decode(const BinaryBitmap& image, int maxSymbols) const
{
	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};

#ifdef PRINT_DEBUG
	LogMatrixWriter lmw(log, *binImg, 5, "qr-log.pnm");
#endif
	
	auto allFPs = FindFinderPatterns(*binImg, _opts.tryHarder());

#ifdef PRINT_DEBUG
	printf("allFPs: %d\n", Size(allFPs));
#endif

	std::vector<ConcentricPattern> usedFPs;
	Barcodes res;
	
	if (_opts.hasFormat(BarcodeFormat::QRCode)) {
		auto allFPSets = GenerateFinderPatternSets(allFPs);
		for (const auto& fpSet : allFPSets) {
			if (Contains(usedFPs, fpSet.bl) || Contains(usedFPs, fpSet.tl) || Contains(usedFPs, fpSet.tr))
				continue;

			logFPSet(fpSet);

			auto detectorResult = SampleQR(*binImg, fpSet);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid()) {
					usedFPs.push_back(fpSet.bl);
					usedFPs.push_back(fpSet.tl);
					usedFPs.push_back(fpSet.tr);
				}
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::QRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}
			}
		}
	}
	
	if (_opts.hasFormat(BarcodeFormat::MicroQRCode) && !(maxSymbols && Size(res) == maxSymbols)) {
		for (const auto& fp : allFPs) {
			if (Contains(usedFPs, fp))
				continue;

			auto detectorResult = SampleMQR(*binImg, fp);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::MicroQRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}

			}
		}
	}
	
	if (_opts.hasFormat(BarcodeFormat::RMQRCode) && !(maxSymbols && Size(res) == maxSymbols)) {
		// TODO proper
		for (const auto& fp : allFPs) {
			if (Contains(usedFPs, fp))
				continue;

			auto detectorResult = SampleRMQR(*binImg, fp);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::RMQRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}

			}
		}
	}

	return res;
}